

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86.cpp
# Opt level: O2

int __thiscall ncnn::LRN_x86::forward_inplace(LRN_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint _w;
  uint _h;
  size_t _elemsize;
  int *piVar2;
  void *pvVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  _func_int **pp_Var8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int k;
  int iVar12;
  _func_int *p_Var13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int _c;
  int iVar18;
  int iVar19;
  long lVar20;
  int q;
  uint uVar21;
  int j;
  ulong uVar22;
  int iVar23;
  float fVar24;
  Mat square_sum;
  Mat square_blob;
  Option opt_b;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  _w = bottom_top_blob->w;
  _h = bottom_top_blob->h;
  iVar12 = bottom_top_blob->c;
  _elemsize = bottom_top_blob->elemsize;
  square_blob.cstep = 0;
  square_blob.data = (void *)0x0;
  square_blob.refcount._0_4_ = 0;
  square_blob.refcount._4_4_ = 0;
  square_blob.elemsize._0_4_ = 0;
  square_blob.elemsize._4_4_ = 0;
  square_blob.elempack = 0;
  square_blob.allocator = (Allocator *)0x0;
  square_blob.dims = 0;
  square_blob.w = 0;
  square_blob.h = 0;
  square_blob.d = 0;
  square_blob.c = 0;
  Mat::create(&square_blob,_w,_h,iVar12,_elemsize,opt->workspace_allocator);
  iVar15 = -100;
  if ((square_blob.data == (void *)0x0) || ((long)square_blob.c * square_blob.cstep == 0))
  goto LAB_001d2d2d;
  iVar23 = _h * _w;
  iVar15 = 0;
  if (iVar23 < 1) {
    iVar23 = 0;
  }
  iVar17 = 0;
  if (0 < iVar12) {
    iVar17 = iVar12;
  }
  for (; iVar15 != iVar17; iVar15 = iVar15 + 1) {
    Mat::channel(&square_sum,bottom_top_blob,iVar15);
    pvVar3 = square_sum.data;
    Mat::~Mat(&square_sum);
    Mat::channel(&square_sum,&square_blob,iVar15);
    pvVar4 = square_sum.data;
    Mat::~Mat(&square_sum);
    for (lVar7 = 0; iVar23 != (int)lVar7; lVar7 = lVar7 + 1) {
      fVar1 = *(float *)((long)pvVar3 + lVar7 * 4);
      *(float *)((long)pvVar4 + lVar7 * 4) = fVar1 * fVar1;
    }
  }
  pp_Var8 = this->_vptr_LRN_x86;
  if (*(int *)(&this->field_0xd0 + (long)pp_Var8[-3]) == 0) {
    square_sum.cstep = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.elempack = 0;
    square_sum.allocator = (Allocator *)0x0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.d = 0;
    square_sum.c = 0;
    Mat::create(&square_sum,_w,_h,iVar12,_elemsize,opt->workspace_allocator);
    if ((square_sum.data == (void *)0x0) || ((long)square_sum.c * square_sum.cstep == 0)) {
LAB_001d2d20:
      Mat::~Mat(&square_sum);
      iVar15 = -100;
      goto LAB_001d2d2d;
    }
    Mat::fill(&square_sum,0.0);
    fVar1 = *(float *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86[-3]);
    iVar15 = *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86[-3]);
    for (iVar18 = 0; iVar18 != iVar17; iVar18 = iVar18 + 1) {
      iVar19 = *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86[-3]);
      for (_c = iVar19 / -2 + iVar18; _c <= iVar19 / 2 + iVar18; _c = _c + 1) {
        if (_c < iVar12 && -1 < _c) {
          Mat::channel((Mat *)&opt_b,&square_blob,_c);
          uVar5 = opt_b._0_8_;
          Mat::~Mat((Mat *)&opt_b);
          Mat::channel((Mat *)&opt_b,&square_sum,iVar18);
          uVar6 = opt_b._0_8_;
          Mat::~Mat((Mat *)&opt_b);
          for (lVar7 = 0; iVar23 != (int)lVar7; lVar7 = lVar7 + 1) {
            *(float *)(uVar6 + lVar7 * 4) =
                 *(float *)(uVar6 + lVar7 * 4) + *(float *)(uVar5 + lVar7 * 4);
          }
          iVar19 = *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86[-3]);
        }
      }
      Mat::channel((Mat *)&opt_b,bottom_top_blob,iVar18);
      uVar5 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      Mat::channel((Mat *)&opt_b,&square_sum,iVar18);
      uVar6 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      pp_Var8 = this->_vptr_LRN_x86;
      for (lVar7 = 0; iVar23 != (int)lVar7; lVar7 = lVar7 + 1) {
        fVar24 = powf(*(float *)(uVar6 + lVar7 * 4) * fVar1 * (1.0 / (float)iVar15) +
                      *(float *)(&this->field_0xe0 + (long)pp_Var8[-3]),
                      -*(float *)(&this->field_0xdc + (long)pp_Var8[-3]));
        *(float *)(uVar5 + lVar7 * 4) = fVar24 * *(float *)(uVar5 + lVar7 * 4);
      }
    }
  }
  else {
    iVar15 = 0;
    if (*(int *)(&this->field_0xd0 + (long)pp_Var8[-3]) != 1) goto LAB_001d2d2d;
    piVar2 = (int *)CONCAT44(square_blob.refcount._4_4_,square_blob.refcount._0_4_);
    square_sum.data = square_blob.data;
    square_sum.refcount._0_4_ = square_blob.refcount._0_4_;
    square_sum.refcount._4_4_ = square_blob.refcount._4_4_;
    square_sum.elemsize._0_4_ = (undefined4)square_blob.elemsize;
    square_sum.elemsize._4_4_ = square_blob.elemsize._4_4_;
    square_sum.elempack = square_blob.elempack;
    square_sum.allocator = square_blob.allocator;
    square_sum.dims = square_blob.dims;
    square_sum.w = square_blob.w;
    square_sum.h = square_blob.h;
    square_sum.d = square_blob.d;
    square_sum.c = square_blob.c;
    square_sum.cstep = square_blob.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
      pp_Var8 = this->_vptr_LRN_x86;
    }
    p_Var13 = pp_Var8[-3];
    uVar21 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
    uVar16 = _w;
    if (1 < (int)uVar21) {
      uVar21 = uVar21 >> 1;
      opt_b.lightmode = opt->lightmode;
      opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_b.num_threads = opt->num_threads;
      opt_b.workspace_allocator = opt->workspace_allocator;
      opt_b.openmp_blocktime = opt->openmp_blocktime;
      opt_b.use_winograd_convolution = opt->use_winograd_convolution;
      opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_b.use_int8_inference = opt->use_int8_inference;
      opt_b.use_vulkan_compute = opt->use_vulkan_compute;
      opt_b.use_bf16_storage = opt->use_bf16_storage;
      opt_b.use_fp16_packed = opt->use_fp16_packed;
      opt_b.use_fp16_storage = opt->use_fp16_storage;
      opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_b.use_int8_packed = opt->use_int8_packed;
      opt_b.use_int8_storage = opt->use_int8_storage;
      opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_b.use_packing_layout = opt->use_packing_layout;
      opt_b.use_shader_pack8 = opt->use_shader_pack8;
      opt_b.use_subgroup_basic = opt->use_subgroup_basic;
      opt_b.use_subgroup_vote = opt->use_subgroup_vote;
      opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_b.use_image_storage = opt->use_image_storage;
      opt_b.use_tensor_storage = opt->use_tensor_storage;
      opt_b.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      opt_b.flush_denormals = opt->flush_denormals;
      opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_b.use_reserved_1 = opt->use_reserved_1;
      opt_b.use_reserved_2 = opt->use_reserved_2;
      opt_b.use_reserved_3 = opt->use_reserved_3;
      opt_b.use_reserved_4 = opt->use_reserved_4;
      opt_b.use_reserved_5 = opt->use_reserved_5;
      opt_b.use_reserved_6 = opt->use_reserved_6;
      opt_b.use_reserved_7 = opt->use_reserved_7;
      opt_b.use_reserved_8 = opt->use_reserved_8;
      opt_b.use_reserved_9 = opt->use_reserved_9;
      opt_b.use_reserved_10 = opt->use_reserved_10;
      opt_b.use_reserved_11 = opt->use_reserved_11;
      opt_b.blob_allocator = opt->workspace_allocator;
      iVar12 = ~uVar21 + *(int *)(&this->field_0xd4 + (long)pp_Var8[-3]);
      copy_make_border(&square_blob,&square_sum,uVar21,iVar12,uVar21,iVar12,0,0.0,&opt_b);
      if ((square_sum.data == (void *)0x0) || ((long)square_sum.c * square_sum.cstep == 0))
      goto LAB_001d2d20;
      p_Var13 = this->_vptr_LRN_x86[-3];
      uVar21 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      uVar16 = square_sum.w;
    }
    uVar21 = uVar21 * uVar21;
    fVar1 = *(float *)(&this->field_0xd8 + (long)p_Var13);
    std::vector<int,_std::allocator<int>_>::vector
              (&_space_ofs,(ulong)uVar21,(allocator_type *)&opt_b);
    pp_Var8 = this->_vptr_LRN_x86;
    iVar12 = *(int *)(&this->field_0xd4 + (long)pp_Var8[-3]);
    iVar15 = uVar16 - iVar12;
    lVar7 = 0;
    iVar23 = 0;
    for (iVar18 = 0; iVar18 < iVar12; iVar18 = iVar18 + 1) {
      for (lVar20 = 0; iVar19 = (int)lVar20, iVar19 < iVar12; lVar20 = lVar20 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar7 + lVar20] = iVar23 + iVar19;
        iVar12 = *(int *)(&this->field_0xd4 + (long)pp_Var8[-3]);
      }
      iVar23 = iVar23 + iVar15 + iVar19;
      lVar7 = (int)lVar7 + lVar20;
    }
    uVar11 = 0;
    uVar9 = (ulong)_w;
    if ((int)_w < 1) {
      uVar9 = uVar11;
    }
    uVar10 = (ulong)_h;
    if ((int)_h < 1) {
      uVar10 = uVar11;
    }
    while( true ) {
      iVar12 = (int)uVar11;
      if (iVar12 == iVar17) break;
      Mat::channel((Mat *)&opt_b,bottom_top_blob,iVar12);
      lVar7 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      Mat::channel((Mat *)&opt_b,&square_sum,iVar12);
      for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
        lVar20 = (long)(int)opt_b._44_4_ * uVar11 * (long)opt_b.workspace_allocator + opt_b._0_8_;
        pp_Var8 = this->_vptr_LRN_x86;
        for (uVar22 = 0; uVar22 != uVar9; uVar22 = uVar22 + 1) {
          fVar24 = 0.0;
          for (uVar14 = 0; uVar21 != uVar14; uVar14 = uVar14 + 1) {
            fVar24 = fVar24 + *(float *)(uVar22 * 4 + lVar20 +
                                        (long)_space_ofs.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar14] * 4);
          }
          fVar24 = powf(fVar24 * fVar1 * (1.0 / (float)(int)uVar21) +
                        *(float *)(&this->field_0xe0 + (long)pp_Var8[-3]),
                        -*(float *)(&this->field_0xdc + (long)pp_Var8[-3]));
          *(float *)(lVar7 + uVar22 * 4) = fVar24 * *(float *)(lVar7 + uVar22 * 4);
        }
        lVar7 = lVar7 + (long)(int)_w * 4;
      }
      Mat::~Mat((Mat *)&opt_b);
      uVar11 = (ulong)(iVar12 + 1);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  Mat::~Mat(&square_sum);
  iVar15 = 0;
LAB_001d2d2d:
  Mat::~Mat(&square_blob);
  return iVar15;
}

Assistant:

int LRN_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}